

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

bool DnsStats::GetTLD(uint8_t *packet,uint32_t length,uint32_t start,uint32_t *offset,
                     uint32_t *previous_offset,int *nb_name_parts)

{
  uint32_t local_54;
  int local_50;
  uint32_t previous_recursive;
  int nb_parts_recursive;
  uint32_t new_start;
  int nb_parts;
  uint32_t name_start;
  uint32_t previous;
  uint32_t previous_o;
  uint32_t l;
  bool ret;
  int *nb_name_parts_local;
  uint32_t *previous_offset_local;
  uint32_t *offset_local;
  uint32_t start_local;
  uint32_t length_local;
  uint8_t *packet_local;
  
  previous_o._3_1_ = true;
  name_start = 0;
  nb_parts = 0;
  nb_parts_recursive = 0;
  offset_local._0_4_ = start;
  do {
    _l = nb_name_parts;
    nb_name_parts_local = (int *)previous_offset;
    if (length <= (uint32_t)offset_local) {
LAB_0019101f:
      if (_l != (int *)0x0) {
        *_l = nb_parts_recursive;
      }
      if (nb_name_parts_local != (int *)0x0) {
        *nb_name_parts_local = name_start;
      }
      return (bool)previous_o._3_1_;
    }
    previous = (uint32_t)packet[(uint32_t)offset_local];
    if (previous == 0) {
      if (nb_parts_recursive == 0) {
        *offset = (uint32_t)offset_local;
      }
      else {
        *offset = nb_parts;
      }
      goto LAB_0019101f;
    }
    if ((previous & 0xc0) == 0xc0) {
      if (length < (uint32_t)offset_local + 2) {
        previous_o._3_1_ = false;
      }
      else {
        previous_recursive = (previous & 0x3f) * 0x100 + (uint)packet[(uint32_t)offset_local + 1];
        if (previous_recursive < start) {
          local_50 = 0;
          local_54 = 0;
          new_start = start;
          previous_offset_local = offset;
          offset_local._4_4_ = length;
          _start_local = packet;
          previous_o._3_1_ = GetTLD(packet,length,previous_recursive,offset,&local_54,&local_50);
          if (local_54 == 0) {
            name_start = nb_parts;
          }
          else {
            name_start = local_54;
          }
          nb_parts_recursive = local_50 + nb_parts_recursive;
        }
        else {
          previous_o._3_1_ = false;
        }
      }
      goto LAB_0019101f;
    }
    if (0x3f < previous) {
      previous_o._3_1_ = false;
      goto LAB_0019101f;
    }
    if (length < (uint32_t)offset_local + previous + 1) {
      previous_o._3_1_ = false;
      goto LAB_0019101f;
    }
    nb_parts_recursive = nb_parts_recursive + 1;
    name_start = nb_parts;
    nb_parts = (uint32_t)offset_local;
    offset_local._0_4_ = previous + 1 + (uint32_t)offset_local;
  } while( true );
}

Assistant:

bool DnsStats::GetTLD(uint8_t * packet, uint32_t length, uint32_t start, uint32_t * offset,
    uint32_t * previous_offset,  int * nb_name_parts)
{
    bool ret = true;
    uint32_t l = 0;
    uint32_t previous_o = 0;
    uint32_t previous = 0;
    uint32_t name_start = start;
    int nb_parts = 0;

    while (start < length)
    {
        l = packet[start];

        if (l == 0)
        {
            /* end of parsing*/

            if (nb_parts != 0)
            {
                *offset = previous;
            }
            else
            {
                *offset = start;
            }
            break;
        }
        else if ((l & 0xC0) == 0xC0)
        {
            /* Name compression */
            if ((start + 2) > length)
            {
                ret = false;
                break;
            }
            else
            {
                uint32_t new_start = ((l & 63) << 8) + packet[start + 1];
                
                if (new_start < name_start)
                {
                    int nb_parts_recursive = 0;
                    uint32_t previous_recursive = 0;

                    ret = GetTLD(packet, length, new_start, offset, &previous_recursive, &nb_parts_recursive);
                    if (previous_recursive != 0) {
                        previous_o = previous_recursive;
                    }
                    else {
                        previous_o = previous;
                    }
                    nb_parts += nb_parts_recursive;
                }
                else
                {
                    ret = false;
                }
                break;
            }
        }
        else if (l > 0x3F)
        {
            /* Unexpected name part */
            ret = false;
            break;
        }
        else
        {
            if (start + l + 1 > length)
            {
                /* malformed name part */
                ret = false;
                break;
            }
            else
            {
                nb_parts++;
                previous_o = previous;
                previous = start;
                start += l + 1;
            }
        }
    }

    if (nb_name_parts != NULL) {
        *nb_name_parts = nb_parts;
    }

    if (previous_offset != NULL) {
        *previous_offset = previous_o;
    }

    return ret;
}